

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

bool QMetaType::canView(QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Type *this;
  function<bool_(void_*,_void_*)> *pfVar4;
  QMetaType in_RSI;
  pair<int,_int> k;
  QMetaTypeInterface *in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesMutableViewRegistry>_>
  *this_00;
  long in_FS_OFFSET;
  QMetaType in_stack_ffffffffffffffc8;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesMutableViewRegistry>_>
             *)&stack0xffffffffffffffd0;
  local_28.d_ptr = in_RDI;
  iVar2 = registerHelper(&local_28);
  iVar3 = registerHelper((QMetaType *)this_00);
  if (iVar3 == 0 || iVar2 == 0) {
    bVar1 = false;
  }
  else {
    this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesMutableViewRegistry>_>
           ::operator()(this_00);
    k.second = iVar3;
    k.first = iVar2;
    pfVar4 = QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>::
             function((QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>
                       *)this,k);
    bVar1 = true;
    if (pfVar4 == (function<bool_(void_*,_void_*)> *)0x0) {
      iVar2 = qMetaTypeId<QSequentialIterable>();
      if (iVar3 == iVar2) {
        local_20.d_ptr = local_28.d_ptr;
        iVar2 = registerHelper(&local_20);
        if ((iVar2 - 9U < 0x29) &&
           (bVar1 = true, (0x1000000000fU >> ((ulong)(iVar2 - 9U) & 0x3f) & 1) != 0))
        goto LAB_0026f948;
      }
      else {
        iVar2 = qMetaTypeId<QAssociativeIterable>();
        if (iVar3 != iVar2) {
          bVar1 = canConvertMetaObject(local_28,in_RSI);
          goto LAB_0026f948;
        }
        local_20.d_ptr = local_28.d_ptr;
        iVar2 = registerHelper(&local_20);
        bVar1 = true;
        if ((iVar2 == 8) || (iVar2 == 0x1c)) goto LAB_0026f948;
      }
      bVar1 = canView(in_RSI,in_stack_ffffffffffffffc8);
    }
  }
LAB_0026f948:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QMetaType::canView(QMetaType fromType, QMetaType toType)
{
    int fromTypeId = fromType.id();
    int toTypeId = toType.id();

    if (fromTypeId == UnknownType || toTypeId == UnknownType)
        return false;

    const auto f = customTypesMutableViewRegistry()->function({fromTypeId, toTypeId});
    if (f)
        return true;

    if (toTypeId == qMetaTypeId<QSequentialIterable>())
        return canImplicitlyViewAsSequentialIterable(fromType);

    if (toTypeId == qMetaTypeId<QAssociativeIterable>())
        return canImplicitlyViewAsAssociativeIterable(fromType);

    if (canConvertMetaObject(fromType, toType))
        return true;

    return false;
}